

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

ssize_t __thiscall covenant::CFG::write(CFG *this,int __fd,void *__buf,size_t __n)

{
  ostream *this_00;
  ulong uVar1;
  size_type sVar2;
  undefined4 in_register_00000034;
  uint vv;
  uint in_stack_00000054;
  ostream *in_stack_00000058;
  CFG *in_stack_00000060;
  CFG *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  Sym s;
  uint local_18;
  
  s.x = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  std::operator<<((ostream *)CONCAT44(in_register_00000034,__fd),"start symbol: ");
  startSym(in_stack_ffffffffffffffc8);
  this_00 = covenant::operator<<((ostream *)in_stack_ffffffffffffffc8,s);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_18 = 0;
  while( true ) {
    uVar1 = (ulong)local_18;
    sVar2 = std::
            vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
            ::size(&this->prods);
    if (sVar2 <= uVar1) break;
    printProduction(in_stack_00000060,in_stack_00000058,in_stack_00000054);
    local_18 = local_18 + 1;
  }
  return (ssize_t)(ostream *)CONCAT44(in_register_00000034,__fd);
}

Assistant:

ostream & write(ostream &o) const 
    {
      o << "start symbol: " << startSym () << endl;
      for( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        printProduction(o, vv);
      }
      return o;
    }